

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_slice.c
# Opt level: O1

RK_S32 pred_weight_table(HEVCContext *s,BitReadCtx_t *gb)

{
  byte bVar1;
  uint uVar2;
  RK_U32 RVar3;
  char cVar4;
  RK_S16 RVar5;
  MPP_RET MVar6;
  int iVar7;
  RK_S32 RVar8;
  int iVar9;
  size_t sVar10;
  void *pvVar11;
  short sVar12;
  long lVar13;
  ulong uVar14;
  RK_S32 _out_9;
  RK_U8 luma_weight_l1_flag [16];
  RK_U8 luma_weight_l0_flag [16];
  RK_U8 chroma_weight_l1_flag [16];
  RK_U8 chroma_weight_l0_flag [16];
  RK_U32 local_84;
  RK_S16 (*local_80) [2];
  int local_78 [4];
  RK_U32 local_68 [4];
  RK_S32 local_58 [4];
  RK_S32 local_48 [6];
  
  MVar6 = mpp_read_ue(gb,local_68);
  gb->ret = MVar6;
  if (MVar6 == MPP_OK) {
    (s->sh).luma_log2_weight_denom = (RK_U8)local_68[0];
    if (s->sps->chroma_format_idc != 0) {
      MVar6 = mpp_read_se(gb,(RK_S32 *)local_68);
      gb->ret = MVar6;
      if (MVar6 != MPP_OK) {
        return MVar6;
      }
      iVar7 = (s->sh).luma_log2_weight_denom + local_68[0];
      iVar9 = 7;
      if (iVar7 < 7) {
        iVar9 = iVar7;
      }
      RVar5 = 0;
      if (0 < iVar9) {
        RVar5 = (RK_S16)iVar9;
      }
      (s->sh).chroma_log2_weight_denom = RVar5;
    }
    uVar2 = (s->sh).nb_refs[0];
    sVar10 = (size_t)uVar2;
    if (uVar2 != 0) {
      uVar14 = 0;
      do {
        MVar6 = mpp_read_bits(gb,1,local_48);
        cVar4 = (char)local_48[0];
        gb->ret = MVar6;
        if (MVar6 != MPP_OK) {
          return MVar6;
        }
        *(char *)((long)local_68 + uVar14) = (char)local_48[0];
        if (cVar4 == '\0') {
          (s->sh).luma_weight_l0[uVar14] = (RK_S16)(1 << ((s->sh).luma_log2_weight_denom & 0x1f));
          (s->sh).luma_offset_l0[uVar14] = 0;
        }
        uVar14 = uVar14 + 1;
        sVar10 = (size_t)(s->sh).nb_refs[0];
      } while (uVar14 < sVar10);
    }
    MVar6 = (MPP_RET)sVar10;
    if (s->sps->chroma_format_idc == 0) {
      if (MVar6 != MPP_OK) {
        pvVar11 = memset(local_48,0,sVar10);
        MVar6 = (MPP_RET)pvVar11;
      }
    }
    else if ((s->sh).nb_refs[0] != 0) {
      uVar14 = 0;
      do {
        MVar6 = mpp_read_bits(gb,1,local_78);
        gb->ret = MVar6;
        if (MVar6 != MPP_OK) {
          return MVar6;
        }
        *(undefined1 *)((long)local_48 + uVar14) = (undefined1)local_78[0];
        uVar14 = uVar14 + 1;
        MVar6 = (s->sh).nb_refs[0];
      } while (uVar14 < (uint)MVar6);
    }
    if ((s->sh).nb_refs[0] != 0) {
      local_80 = (s->sh).chroma_offset_l0;
      uVar14 = 0;
      do {
        if (*(char *)((long)local_68 + uVar14) != '\0') {
          MVar6 = mpp_read_se(gb,local_78);
          gb->ret = MVar6;
          RVar8 = CONCAT31((int3)((uint)MVar6 >> 8),MVar6 == MPP_OK);
          if (MVar6 == MPP_OK) {
            (s->sh).luma_weight_l0[uVar14] =
                 (short)(1 << ((s->sh).luma_log2_weight_denom & 0x1f)) + (short)local_78[0];
            MVar6 = mpp_read_se(gb,local_78);
            gb->ret = MVar6;
            RVar8 = CONCAT31((int3)((uint)MVar6 >> 8),MVar6 == MPP_OK);
            if (MVar6 == MPP_OK) {
              (s->sh).luma_offset_l0[uVar14] = (RK_S16)local_78[0];
            }
          }
          if ((char)RVar8 == '\0') {
            return RVar8;
          }
        }
        if (*(char *)((long)local_48 + uVar14) == '\0') {
          RVar5 = (RK_S16)(1 << ((byte)(s->sh).chroma_log2_weight_denom & 0x1f));
          (s->sh).chroma_weight_l0[uVar14][0] = RVar5;
          (s->sh).chroma_offset_l0[uVar14] = (RK_S16  [2])0x0;
          (s->sh).chroma_weight_l0[uVar14][1] = RVar5;
        }
        else {
          lVar13 = 0;
          do {
            MVar6 = mpp_read_se(gb,local_78);
            iVar9 = local_78[0];
            gb->ret = MVar6;
            RVar8 = CONCAT31((int3)((uint)MVar6 >> 8),MVar6 == MPP_OK);
            if (MVar6 == MPP_OK) {
              MVar6 = mpp_read_se(gb,local_78);
              gb->ret = MVar6;
              RVar8 = CONCAT31((int3)((uint)MVar6 >> 8),MVar6 == MPP_OK);
              if (MVar6 != MPP_OK) goto LAB_001a02e8;
              bVar1 = (byte)(s->sh).chroma_log2_weight_denom;
              sVar12 = (short)(1 << (bVar1 & 0x1f)) + (short)iVar9;
              local_80[-0x30][lVar13] = sVar12;
              iVar9 = local_78[0] - (((int)sVar12 << 7) >> (bVar1 & 0x1f));
              if (-2 < iVar9) {
                iVar9 = -1;
              }
              if (iVar9 < -0xff) {
                iVar9 = -0x100;
              }
              (*local_80)[lVar13] = (short)iVar9 + 0x80;
            }
            else {
LAB_001a02e8:
              if ((char)RVar8 == '\0') {
                return RVar8;
              }
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 == 1);
        }
        uVar14 = uVar14 + 1;
        MVar6 = (s->sh).nb_refs[0];
        local_80 = local_80 + 1;
      } while (uVar14 < (uint)MVar6);
    }
    if ((s->sh).slice_type == B_SLICE) {
      uVar2 = (s->sh).nb_refs[1];
      sVar10 = (size_t)uVar2;
      if (uVar2 != 0) {
        uVar14 = 0;
        do {
          MVar6 = mpp_read_bits(gb,1,local_58);
          cVar4 = (char)local_58[0];
          gb->ret = MVar6;
          if (MVar6 != MPP_OK) {
            return MVar6;
          }
          *(char *)((long)local_78 + uVar14) = (char)local_58[0];
          if (cVar4 == '\0') {
            (s->sh).luma_weight_l1[uVar14] = (RK_S16)(1 << ((s->sh).luma_log2_weight_denom & 0x1f));
            (s->sh).luma_offset_l1[uVar14] = 0;
          }
          uVar14 = uVar14 + 1;
          sVar10 = (size_t)(s->sh).nb_refs[1];
        } while (uVar14 < sVar10);
      }
      MVar6 = (MPP_RET)sVar10;
      if (s->sps->chroma_format_idc == 0) {
        if (MVar6 != MPP_OK) {
          pvVar11 = memset(local_58,0,sVar10);
          MVar6 = (MPP_RET)pvVar11;
        }
      }
      else if ((s->sh).nb_refs[1] != 0) {
        uVar14 = 0;
        do {
          MVar6 = mpp_read_bits(gb,1,(RK_S32 *)&local_84);
          gb->ret = MVar6;
          if (MVar6 != MPP_OK) {
            return MVar6;
          }
          *(undefined1 *)((long)local_58 + uVar14) = (undefined1)local_84;
          uVar14 = uVar14 + 1;
          MVar6 = (s->sh).nb_refs[1];
        } while (uVar14 < (uint)MVar6);
      }
      if ((s->sh).nb_refs[1] != 0) {
        local_80 = (s->sh).chroma_offset_l1;
        uVar14 = 0;
        do {
          if (*(char *)((long)local_78 + uVar14) != '\0') {
            MVar6 = mpp_read_ue(gb,&local_84);
            gb->ret = MVar6;
            RVar8 = CONCAT31((int3)((uint)MVar6 >> 8),MVar6 == MPP_OK);
            if (MVar6 == MPP_OK) {
              (s->sh).luma_weight_l1[uVar14] =
                   (short)(1 << ((s->sh).luma_log2_weight_denom & 0x1f)) + (short)local_84;
              MVar6 = mpp_read_se(gb,(RK_S32 *)&local_84);
              gb->ret = MVar6;
              RVar8 = CONCAT31((int3)((uint)MVar6 >> 8),MVar6 == MPP_OK);
              if (MVar6 == MPP_OK) {
                (s->sh).luma_offset_l1[uVar14] = (RK_S16)local_84;
              }
            }
            if ((char)RVar8 == '\0') {
              return RVar8;
            }
          }
          if (*(char *)((long)local_58 + uVar14) == '\0') {
            RVar5 = (RK_S16)(1 << ((byte)(s->sh).chroma_log2_weight_denom & 0x1f));
            (s->sh).chroma_weight_l1[uVar14][0] = RVar5;
            (s->sh).chroma_offset_l1[uVar14] = (RK_S16  [2])0x0;
            (s->sh).chroma_weight_l1[uVar14][1] = RVar5;
          }
          else {
            lVar13 = 0;
            do {
              MVar6 = mpp_read_se(gb,(RK_S32 *)&local_84);
              RVar3 = local_84;
              gb->ret = MVar6;
              RVar8 = CONCAT31((int3)((uint)MVar6 >> 8),MVar6 == MPP_OK);
              if (MVar6 == MPP_OK) {
                MVar6 = mpp_read_se(gb,(RK_S32 *)&local_84);
                gb->ret = MVar6;
                RVar8 = CONCAT31((int3)((uint)MVar6 >> 8),MVar6 == MPP_OK);
                if (MVar6 != MPP_OK) goto LAB_001a0534;
                bVar1 = (byte)(s->sh).chroma_log2_weight_denom;
                sVar12 = (short)(1 << (bVar1 & 0x1f)) + (short)RVar3;
                local_80[-0x38][lVar13] = sVar12;
                iVar9 = local_84 - (((int)sVar12 << 7) >> (bVar1 & 0x1f));
                if (-2 < iVar9) {
                  iVar9 = -1;
                }
                if (iVar9 < -0xff) {
                  iVar9 = -0x100;
                }
                (*local_80)[lVar13] = (short)iVar9 + 0x80;
              }
              else {
LAB_001a0534:
                if ((char)RVar8 == '\0') {
                  return RVar8;
                }
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 == 1);
          }
          uVar14 = uVar14 + 1;
          uVar2 = (s->sh).nb_refs[1];
          local_80 = local_80 + 1;
          if (uVar2 <= uVar14) {
            return uVar2;
          }
        } while( true );
      }
    }
  }
  return MVar6;
}

Assistant:

static MPP_RET pred_weight_table(H264_SLICE_t *currSlice)
{
    RK_S32 se_tmp = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_S32 i = 0, j = 0, temp = 0;
    BitReadCtx_t *p_bitctx = &currSlice->p_Cur->bitctx;

    READ_UE(p_bitctx, &temp); //!< log2_weight_denom
    if (currSlice->active_sps->chroma_format_idc) {
        READ_UE(p_bitctx, &temp); //!< log2_weight_denom
    }
    for (i = 0; i < currSlice->num_ref_idx_active[LIST_0]; i++) {
        READ_ONEBIT(p_bitctx, &temp); //!< luma_weight_flag_l0
        if (temp) {
            READ_SE(p_bitctx, &se_tmp); //!< slice->wp_weight[LIST_0][i][0]
            READ_SE(p_bitctx, &se_tmp); //!< slice->wp_offset[LIST_0][i][0]
        }
        if (currSlice->active_sps->chroma_format_idc) {
            READ_ONEBIT(p_bitctx, &temp); //!< chroma_weight_flag_l0
            for (j = 1; j < 3; j++) {
                if (temp) { //!< chroma_weight_flag_l0
                    READ_SE(p_bitctx, &se_tmp); //!< slice->wp_weight[LIST_0][i][j]
                    READ_SE(p_bitctx, &se_tmp); //!< slice->wp_offset[LIST_0][i][j]
                }
            }
        }
    }

    if ((currSlice->slice_type == H264_B_SLICE) && currSlice->p_Vid->active_pps->weighted_bipred_idc == 1) {
        for (i = 0; i < currSlice->num_ref_idx_active[LIST_1]; i++) {
            READ_ONEBIT(p_bitctx, &temp); //!< luma_weight_flag_l1
            if (temp) {
                READ_SE(p_bitctx, &se_tmp); //!< slice->wp_weight[LIST_1][i][0]
                READ_SE(p_bitctx, &se_tmp); //!< slice->wp_offset[LIST_1][i][0]
            }
            if (currSlice->active_sps->chroma_format_idc) {
                READ_ONEBIT(p_bitctx, &temp); //!< chroma_weight_flag_l1
                for (j = 1; j < 3; j++) {
                    if (temp) { // chroma_weight_flag_l1
                        READ_SE(p_bitctx, &se_tmp); //!< slice->wp_weight[LIST_1][i][j]
                        READ_SE(p_bitctx, &se_tmp); //!< slice->wp_offset[LIST_1][i][j]
                    }
                }
            }
        }
    }

    return ret = MPP_OK;
__BITREAD_ERR:
    return ret = p_bitctx->ret;
}